

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_mirjit.c
# Opt level: O3

int raviV_initjit(lua_State *L)

{
  global_State *pgVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  ravi_State *prVar3;
  MIR_context_t pMVar4;
  long lVar5;
  long *__ptr;
  double dVar6;
  
  pgVar1 = L->l_G;
  iVar2 = -1;
  if (pgVar1->ravi_state == (ravi_State *)0x0) {
    lVar5 = 1;
    prVar3 = (ravi_State *)calloc(1,0x88);
    prVar3->min_code_size_ = 0x96;
    prVar3->min_exec_count_ = 0x32;
    *(undefined2 *)&prVar3->field_0x10 = 0x50;
    dVar6 = (double)_MIR_get_api_version();
    if ((dVar6 != 0.2) || (NAN(dVar6))) {
      raviV_initjit_cold_1();
      lVar5 = *(long *)(lVar5 + 0x18);
      __ptr = *(long **)(lVar5 + 0x568);
      if (__ptr != (long *)0x0) {
        if (*__ptr != 0) {
          MIR_finish(*__ptr);
          __ptr = *(long **)(lVar5 + 0x568);
        }
        free(__ptr);
        return extraout_EAX_00;
      }
      return extraout_EAX;
    }
    pMVar4 = (MIR_context_t)_MIR_init();
    prVar3->jit = pMVar4;
    iVar2 = 0;
    pgVar1->ravi_state = prVar3;
  }
  return iVar2;
}

Assistant:

int raviV_initjit(struct lua_State *L) {
  global_State *G = G(L);
  if (G->ravi_state != NULL)
    return -1;
  ravi_State *jit = (ravi_State *)calloc(1, sizeof(ravi_State));
  jit->auto_ = 0;
  jit->enabled_ = 1;
  jit->min_code_size_ = 150;
  jit->min_exec_count_ = 50;
  jit->opt_level_ = 2;
  // The parameter true means we will be dumping stuff as we compile
  jit->jit = MIR_init();
  G->ravi_state = jit;
  return 0;
}